

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

HighsStatus applyScalingToLpCol(HighsLp *lp,HighsInt col,double colScale)

{
  reference pvVar1;
  int in_ESI;
  HighsSparseMatrix *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double new_upper;
  double dVar3;
  double dVar4;
  HighsStatus local_4;
  
  if (in_ESI < 0) {
    local_4 = kError;
  }
  else if (in_ESI < (int)in_RDI->format_) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      HighsSparseMatrix::scaleCol(in_RDI,in_ESI,in_XMM0_Qa);
      dVar3 = in_XMM0_Qa;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&in_RDI->num_row_,(long)in_ESI)
      ;
      *pvVar1 = in_XMM0_Qa * *pvVar1;
      if (dVar3 <= 0.0) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &(in_RDI->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
        dVar2 = *pvVar1 / dVar3;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &(in_RDI->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
        dVar4 = *pvVar1;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &(in_RDI->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
        *pvVar1 = dVar4 / dVar3;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &(in_RDI->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
        *pvVar1 = dVar2;
      }
      else {
        dVar4 = dVar3;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &(in_RDI->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
        *pvVar1 = *pvVar1 / dVar3;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &(in_RDI->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
        *pvVar1 = *pvVar1 / dVar4;
      }
      local_4 = kOk;
    }
    else {
      local_4 = kError;
    }
  }
  else {
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus applyScalingToLpCol(HighsLp& lp, const HighsInt col,
                                const double colScale) {
  if (col < 0) return HighsStatus::kError;
  if (col >= lp.num_col_) return HighsStatus::kError;
  if (!colScale) return HighsStatus::kError;

  lp.a_matrix_.scaleCol(col, colScale);
  lp.col_cost_[col] *= colScale;
  if (colScale > 0) {
    lp.col_lower_[col] /= colScale;
    lp.col_upper_[col] /= colScale;
  } else {
    const double new_upper = lp.col_lower_[col] / colScale;
    lp.col_lower_[col] = lp.col_upper_[col] / colScale;
    lp.col_upper_[col] = new_upper;
  }
  return HighsStatus::kOk;
}